

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

size_t __thiscall mocker::ir::Interpreter::executeInst(Interpreter *this,size_t idx)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long val_;
  bool bVar2;
  OpType OVar3;
  OpType OVar4;
  OpType OVar5;
  FuncModule *pFVar6;
  const_reference pvVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  int64_t iVar12;
  element_type *peVar13;
  long *plVar14;
  element_type *peVar15;
  _func_int **val_00;
  element_type *peVar16;
  element_type *peVar17;
  void *pvVar18;
  element_type *peVar19;
  element_type *peVar20;
  __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var21;
  element_type *peVar22;
  size_t sVar23;
  mapped_type *pmVar24;
  element_type *peVar25;
  shared_ptr<mocker::ir::Addr> *psVar26;
  reference pvVar27;
  element_type *peVar28;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *this_00;
  string *funcName;
  int64_t iVar29;
  __shared_ptr *p_Var30;
  shared_ptr<mocker::ir::Reg> *psVar31;
  shared_ptr<mocker::ir::Label> *local_548;
  ulong local_398;
  undefined1 local_340 [8];
  shared_ptr<mocker::ir::Phi> phi;
  vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_> phis;
  shared_ptr<mocker::ir::Phi> p_12;
  int64_t val_2;
  reference local_2e8;
  shared_ptr<mocker::ir::Addr> *argReg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *__range3;
  vector<long,_std::allocator<long>_> args;
  shared_ptr<mocker::ir::Call> p_11;
  shared_ptr<mocker::ir::Ret> p_10;
  undefined1 local_288 [8];
  shared_ptr<mocker::ir::Jump> p_9;
  undefined1 local_270 [8];
  shared_ptr<mocker::ir::Label> nxtLabel;
  int64_t condition;
  shared_ptr<mocker::ir::Branch> p_8;
  void *res_2;
  size_t sz;
  shared_ptr<mocker::ir::Malloc> p_7;
  void *res_1;
  shared_ptr<mocker::ir::Alloca> p_6;
  int64_t *addr_1;
  int64_t val_1;
  shared_ptr<mocker::ir::Store> p_5;
  int64_t val;
  int64_t *addr;
  shared_ptr<mocker::ir::Load> p_4;
  ulong local_190;
  int64_t res;
  int64_t rhs_1;
  int64_t lhs_1;
  shared_ptr<mocker::ir::RelationInst> p_3;
  shared_ptr<mocker::ir::Addr> local_158;
  shared_ptr<mocker::ir::Addr> local_148;
  shared_ptr<mocker::ir::Addr> local_138;
  shared_ptr<mocker::ir::Addr> local_128;
  shared_ptr<mocker::ir::Addr> local_118;
  shared_ptr<mocker::ir::Addr> local_108;
  shared_ptr<mocker::ir::Addr> local_f8;
  shared_ptr<mocker::ir::Addr> local_e8;
  shared_ptr<mocker::ir::Addr> local_d8;
  ulong local_c8;
  int64_t rhs;
  int64_t lhs;
  shared_ptr<mocker::ir::ArithBinaryInst> p_2;
  int64_t operand_1;
  shared_ptr<mocker::ir::ArithUnaryInst> p_1;
  shared_ptr<mocker::ir::Addr> local_78;
  int64_t local_68;
  int64_t operand;
  undefined1 local_50 [8];
  shared_ptr<mocker::ir::Assign> p;
  reference_wrapper<const_mocker::ir::Interpreter::FuncModule> *func;
  value_type inst;
  value_type *ar;
  size_t idx_local;
  Interpreter *this_local;
  
  inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       stack<mocker::ir::Interpreter::ActivationRecord,_std::deque<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>_>
       ::top(&this->ars);
  pFVar6 = std::reference_wrapper<const_mocker::ir::Interpreter::FuncModule>::get
                     ((reference_wrapper<const_mocker::ir::Interpreter::FuncModule> *)
                      inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  pvVar7 = std::
           vector<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::at(&pFVar6->insts,idx);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr((shared_ptr<mocker::ir::IRInst> *)&func,pvVar7);
  p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>&>
            ((ir *)local_50,(shared_ptr<mocker::ir::IRInst> *)&func);
  p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
  if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_1_) {
    peVar8 = std::__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    psVar26 = Assign::getOperand(peVar8);
    local_68 = readVal(this,psVar26);
    peVar8 = std::__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    psVar31 = Definition::getDest(&peVar8->super_Definition);
    std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_78,psVar31);
    writeReg<long>(this,&local_78,local_68);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_78);
    this_local = (Interpreter *)(idx + 1);
  }
  p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _5_3_ = 0;
  std::shared_ptr<mocker::ir::Assign>::~shared_ptr((shared_ptr<mocker::ir::Assign> *)local_50);
  if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ == 0) {
    dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>&>
              ((ir *)&operand_1,(shared_ptr<mocker::ir::IRInst> *)&func);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&operand_1);
    if (bVar2) {
      peVar9 = std::
               __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&operand_1);
      psVar26 = ArithUnaryInst::getOperand(peVar9);
      local_398 = readVal(this,psVar26);
      peVar9 = std::
               __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&operand_1);
      psVar31 = Definition::getDest(&peVar9->super_Definition);
      std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                ((shared_ptr<mocker::ir::Addr> *)
                 &p_2.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,psVar31);
      peVar9 = std::
               __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&operand_1);
      OVar3 = ArithUnaryInst::getOp(peVar9);
      if (OVar3 == Neg) {
        local_398 = -local_398;
      }
      else {
        local_398 = local_398 ^ 0xffffffffffffffff;
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)
                          &p_2.
                           super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,local_398);
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                ((shared_ptr<mocker::ir::Addr> *)
                 &p_2.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_local = (Interpreter *)(idx + 1);
      p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 1;
    }
    else {
      p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 0;
    }
    std::shared_ptr<mocker::ir::ArithUnaryInst>::~shared_ptr
              ((shared_ptr<mocker::ir::ArithUnaryInst> *)&operand_1);
    if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ == 0) {
      dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)&lhs,(shared_ptr<mocker::ir::IRInst> *)&func);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&lhs);
      if (bVar2) {
        peVar10 = std::
                  __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&lhs);
        psVar26 = ArithBinaryInst::getLhs(peVar10);
        rhs = readVal(this,psVar26);
        peVar10 = std::
                  __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&lhs);
        psVar26 = ArithBinaryInst::getRhs(peVar10);
        local_c8 = readVal(this,psVar26);
        peVar10 = std::
                  __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&lhs);
        OVar4 = ArithBinaryInst::getOp(peVar10);
        switch(OVar4) {
        case BitOr:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_d8,psVar31);
          writeReg<long>(this,&local_d8,rhs | local_c8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_d8);
          break;
        case BitAnd:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_e8,psVar31);
          writeReg<long>(this,&local_e8,rhs & local_c8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_e8);
          break;
        case Xor:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_f8,psVar31);
          writeReg<long>(this,&local_f8,rhs ^ local_c8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_f8);
          break;
        case Shl:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_108,psVar31);
          writeReg<long>(this,&local_108,rhs << ((byte)local_c8 & 0x3f));
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_108);
          break;
        case Shr:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_118,psVar31);
          writeReg<long>(this,&local_118,rhs >> ((byte)local_c8 & 0x3f));
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_118);
          break;
        case Add:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_128,psVar31);
          writeReg<long>(this,&local_128,rhs + local_c8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_128);
          break;
        case Sub:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_138,psVar31);
          writeReg<long>(this,&local_138,rhs - local_c8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_138);
          break;
        case Mul:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_148,psVar31);
          writeReg<long>(this,&local_148,rhs * local_c8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_148);
          break;
        case Div:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_158,psVar31);
          writeReg<long>(this,&local_158,rhs / (long)local_c8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_158);
          break;
        case Mod:
          peVar10 = std::
                    __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs);
          psVar31 = Definition::getDest(&peVar10->super_Definition);
          p_Var1 = &p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                    ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar31);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)p_Var1,rhs % (long)local_c8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                    ((shared_ptr<mocker::ir::Addr> *)
                     &p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                        ,0x200,"std::size_t mocker::ir::Interpreter::executeInst(std::size_t)");
        }
        this_local = (Interpreter *)(idx + 1);
        p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 1;
      }
      else {
        p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 0;
      }
      std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
                ((shared_ptr<mocker::ir::ArithBinaryInst> *)&lhs);
      if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ == 0) {
        dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)&lhs_1,(shared_ptr<mocker::ir::IRInst> *)&func);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&lhs_1);
        if (bVar2) {
          peVar11 = std::
                    __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs_1);
          psVar26 = RelationInst::getLhs(peVar11);
          iVar29 = readVal(this,psVar26);
          peVar11 = std::
                    __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs_1);
          psVar26 = RelationInst::getRhs(peVar11);
          iVar12 = readVal(this,psVar26);
          peVar11 = std::
                    __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs_1);
          OVar5 = RelationInst::getOp(peVar11);
          switch(OVar5) {
          case Eq:
            local_190 = (ulong)(iVar29 == iVar12);
            break;
          case Ne:
            local_190 = (ulong)(iVar29 != iVar12);
            break;
          case Lt:
            local_190 = (ulong)(iVar29 < iVar12);
            break;
          case Gt:
            local_190 = (ulong)(iVar12 < iVar29);
            break;
          case Le:
            local_190 = (ulong)(iVar29 <= iVar12);
            break;
          case Ge:
            local_190 = (ulong)(iVar12 <= iVar29);
            break;
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                          ,0x21b,"std::size_t mocker::ir::Interpreter::executeInst(std::size_t)");
          }
          peVar11 = std::
                    __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&lhs_1);
          psVar31 = Definition::getDest(&peVar11->super_Definition);
          p_Var1 = &p_4.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ;
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                    ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar31);
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)p_Var1,local_190);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                    ((shared_ptr<mocker::ir::Addr> *)
                     &p_4.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this_local = (Interpreter *)(idx + 1);
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ = 1;
        }
        else {
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ = 0;
        }
        std::shared_ptr<mocker::ir::RelationInst>::~shared_ptr
                  ((shared_ptr<mocker::ir::RelationInst> *)&lhs_1);
        if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ == 0) {
          dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>&>
                    ((ir *)&addr,(shared_ptr<mocker::ir::IRInst> *)&func);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&addr);
          if (bVar2) {
            peVar13 = std::
                      __shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&addr);
            psVar26 = Load::getAddr(peVar13);
            plVar14 = (long *)readVal(this,psVar26);
            val_ = *plVar14;
            peVar13 = std::
                      __shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&addr);
            psVar31 = Definition::getDest(&peVar13->super_Definition);
            p_Var1 = &p_5.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                      ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar31);
            writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)p_Var1,val_);
            std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                      ((shared_ptr<mocker::ir::Addr> *)
                       &p_5.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            this_local = (Interpreter *)(idx + 1);
          }
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._5_3_ = 0;
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_1_ = bVar2;
          std::shared_ptr<mocker::ir::Load>::~shared_ptr((shared_ptr<mocker::ir::Load> *)&addr);
          if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ == 0) {
            dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>&>
                      ((ir *)&val_1,(shared_ptr<mocker::ir::IRInst> *)&func);
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&val_1);
            if (bVar2) {
              peVar15 = std::
                        __shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&val_1);
              psVar26 = Store::getVal(peVar15);
              val_00 = (_func_int **)readVal(this,psVar26);
              peVar15 = std::
                        __shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&val_1);
              psVar26 = Store::getAddr(peVar15);
              p_6.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)readVal(this,psVar26);
              (p_6.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_vptr__Sp_counted_base = val_00;
              printLog(this,(int64_t)p_6.
                                     super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi,(int64_t)val_00);
              this_local = (Interpreter *)(idx + 1);
            }
            p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._5_3_ = 0;
            p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_1_ = bVar2;
            std::shared_ptr<mocker::ir::Store>::~shared_ptr((shared_ptr<mocker::ir::Store> *)&val_1)
            ;
            if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._4_4_ == 0) {
              dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>&>
                        ((ir *)&res_1,(shared_ptr<mocker::ir::IRInst> *)&func);
              bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&res_1);
              if (bVar2) {
                pvVar18 = fastMalloc(this,8);
                peVar16 = std::
                          __shared_ptr_access<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&res_1);
                psVar31 = Definition::getDest(&peVar16->super_Definition);
                p_Var1 = &p_7.super___shared_ptr<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                          ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar31);
                writeReg<void*>(this,(shared_ptr<mocker::ir::Addr> *)p_Var1,pvVar18);
                std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                          ((shared_ptr<mocker::ir::Addr> *)
                           &p_7.super___shared_ptr<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                this_local = (Interpreter *)(idx + 1);
              }
              p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._5_3_ = 0;
              p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_1_ = bVar2;
              std::shared_ptr<mocker::ir::Alloca>::~shared_ptr
                        ((shared_ptr<mocker::ir::Alloca> *)&res_1);
              if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_ == 0) {
                dyc<mocker::ir::Malloc,std::shared_ptr<mocker::ir::IRInst>&>
                          ((ir *)&sz,(shared_ptr<mocker::ir::IRInst> *)&func);
                bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&sz);
                if (bVar2) {
                  peVar17 = std::
                            __shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&sz);
                  psVar26 = Malloc::getSize(peVar17);
                  sVar23 = readVal(this,psVar26);
                  pvVar18 = fastMalloc(this,sVar23);
                  peVar17 = std::
                            __shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mocker::ir::Malloc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&sz);
                  psVar31 = Definition::getDest(&peVar17->super_Definition);
                  p_Var1 = &p_8.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
                  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                            ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar31);
                  writeReg<void*>(this,(shared_ptr<mocker::ir::Addr> *)p_Var1,pvVar18);
                  std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                            ((shared_ptr<mocker::ir::Addr> *)
                             &p_8.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  this_local = (Interpreter *)(idx + 1);
                }
                p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._5_3_ = 0;
                p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._4_1_ = bVar2;
                std::shared_ptr<mocker::ir::Malloc>::~shared_ptr
                          ((shared_ptr<mocker::ir::Malloc> *)&sz);
                if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ == 0) {
                  dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>&>
                            ((ir *)&condition,(shared_ptr<mocker::ir::IRInst> *)&func);
                  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&condition);
                  if (bVar2) {
                    peVar19 = std::
                              __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)&condition);
                    psVar26 = Branch::getCondition(peVar19);
                    nxtLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)readVal(this,psVar26);
                    if (nxtLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      peVar19 = std::
                                __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)&condition);
                      local_548 = Branch::getElse(peVar19);
                    }
                    else {
                      peVar19 = std::
                                __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)&condition);
                      local_548 = Branch::getThen(peVar19);
                    }
                    std::shared_ptr<mocker::ir::Label>::shared_ptr
                              ((shared_ptr<mocker::ir::Label> *)local_270,local_548);
                    inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi[4]._vptr__Sp_counted_base =
                         *(_func_int ***)
                          &inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[4]._M_use_count;
                    peVar22 = std::
                              __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_270);
                    sVar23 = Label::getID(peVar22);
                    inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi[4]._M_use_count = (int)sVar23;
                    inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi[4]._M_weak_count = (int)(sVar23 >> 0x20);
                    pFVar6 = std::reference_wrapper<const_mocker::ir::Interpreter::FuncModule>::get
                                       ((reference_wrapper<const_mocker::ir::Interpreter::FuncModule>
                                         *)p.
                                           super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                    peVar22 = std::
                              __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_270);
                    p_9.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Label::getID(peVar22);
                    pmVar24 = std::
                              unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              ::at(&pFVar6->label2idx,
                                   (key_type *)
                                   &p_9.
                                    super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                    this_local = (Interpreter *)*pmVar24;
                    p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ = 1;
                    std::shared_ptr<mocker::ir::Label>::~shared_ptr
                              ((shared_ptr<mocker::ir::Label> *)local_270);
                  }
                  else {
                    p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ = 0;
                  }
                  std::shared_ptr<mocker::ir::Branch>::~shared_ptr
                            ((shared_ptr<mocker::ir::Branch> *)&condition);
                  if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_ == 0) {
                    dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>&>
                              ((ir *)local_288,(shared_ptr<mocker::ir::IRInst> *)&func);
                    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_288);
                    if (bVar2) {
                      inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi[4]._vptr__Sp_counted_base =
                           *(_func_int ***)
                            &inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi[4]._M_use_count;
                      peVar20 = std::
                                __shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_288);
                      p_Var21 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)Jump::getLabel(peVar20);
                      peVar22 = std::
                                __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->(p_Var21);
                      sVar23 = Label::getID(peVar22);
                      inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi[4]._M_use_count = (int)sVar23;
                      inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi[4]._M_weak_count = (int)(sVar23 >> 0x20);
                      pFVar6 = std::reference_wrapper<const_mocker::ir::Interpreter::FuncModule>::
                               get((reference_wrapper<const_mocker::ir::Interpreter::FuncModule> *)
                                   p.
                                   super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
                      peVar20 = std::
                                __shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_288);
                      p_Var21 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)Jump::getLabel(peVar20);
                      peVar22 = std::
                                __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->(p_Var21);
                      p_10.super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Label::getID(peVar22);
                      pmVar24 = std::
                                unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                ::at(&pFVar6->label2idx,
                                     (key_type *)
                                     &p_10.
                                      super___shared_ptr<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                      this_local = (Interpreter *)*pmVar24;
                    }
                    p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._5_3_ = 0;
                    p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_1_ = bVar2;
                    std::shared_ptr<mocker::ir::Jump>::~shared_ptr
                              ((shared_ptr<mocker::ir::Jump> *)local_288);
                    if (p_1.
                        super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ == 0) {
                      dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>&>
                                ((ir *)&p_11.
                                        super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,(shared_ptr<mocker::ir::IRInst> *)&func);
                      bVar2 = std::__shared_ptr::operator_cast_to_bool
                                        ((__shared_ptr *)
                                         &p_11.
                                          super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                      if (bVar2) {
                        peVar25 = std::
                                  __shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)&p_11.
                                                  super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                        p_Var30 = (__shared_ptr *)Ret::getVal(peVar25);
                        bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var30);
                        if (bVar2) {
                          peVar25 = std::
                                    __shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<mocker::ir::Ret,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&p_11.
                                                  super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                          psVar26 = Ret::getVal(peVar25);
                          iVar29 = readVal(this,psVar26);
                          pvVar27 = std::
                                    stack<mocker::ir::Interpreter::ActivationRecord,_std::deque<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>_>
                                    ::top(&this->ars);
                          pvVar27->retVal = iVar29;
                        }
                        pFVar6 = std::reference_wrapper<const_mocker::ir::Interpreter::FuncModule>::
                                 get((reference_wrapper<const_mocker::ir::Interpreter::FuncModule> *
                                     )p.
                                      super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi);
                        this_local = (Interpreter *)
                                     std::
                                     vector<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                                     ::size(&pFVar6->insts);
                        p_1.
                        super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ = 1;
                      }
                      else {
                        p_1.
                        super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ = 0;
                      }
                      std::shared_ptr<mocker::ir::Ret>::~shared_ptr
                                ((shared_ptr<mocker::ir::Ret> *)
                                 &p_11.
                                  super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
                      if (p_1.
                          super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_ == 0) {
                        dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>&>
                                  ((ir *)&args.super__Vector_base<long,_std::allocator<long>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (shared_ptr<mocker::ir::IRInst> *)&func);
                        bVar2 = std::__shared_ptr::operator_cast_to_bool
                                          ((__shared_ptr *)
                                           &args.super__Vector_base<long,_std::allocator<long>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                        if (bVar2) {
                          std::vector<long,_std::allocator<long>_>::vector
                                    ((vector<long,_std::allocator<long>_> *)&__range3);
                          peVar28 = std::
                                    __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&args.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                          ;
                          this_00 = Call::getArgs(peVar28);
                          __end3 = std::
                                   vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                   ::begin(this_00);
                          argReg = (shared_ptr<mocker::ir::Addr> *)
                                   std::
                                   vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                   ::end(this_00);
                          while (bVar2 = __gnu_cxx::operator!=
                                                   (&__end3,(
                                                  __normal_iterator<const_std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                                  *)&argReg), bVar2) {
                            local_2e8 = __gnu_cxx::
                                        __normal_iterator<const_std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                                        ::operator*(&__end3);
                            val_2 = readVal(this,local_2e8);
                            std::vector<long,_std::allocator<long>_>::emplace_back<long>
                                      ((vector<long,_std::allocator<long>_> *)&__range3,&val_2);
                            __gnu_cxx::
                            __normal_iterator<const_std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                            ::operator++(&__end3);
                          }
                          peVar28 = std::
                                    __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&args.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                          ;
                          funcName = Call::getFuncName_abi_cxx11_(peVar28);
                          iVar29 = executeFunc(this,funcName,
                                               (vector<long,_std::allocator<long>_> *)&__range3);
                          peVar28 = std::
                                    __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&args.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                          ;
                          p_Var30 = (__shared_ptr *)Definition::getDest(&peVar28->super_Definition);
                          bVar2 = std::__shared_ptr::operator_cast_to_bool(p_Var30);
                          if (bVar2) {
                            peVar28 = std::
                                      __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      ::operator->((
                                                  __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)&args.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                            ;
                            psVar31 = Definition::getDest(&peVar28->super_Definition);
                            p_Var1 = &p_12.
                                      super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount;
                            std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                                      ((shared_ptr<mocker::ir::Addr> *)p_Var1,psVar31);
                            writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)p_Var1,iVar29);
                            std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                                      ((shared_ptr<mocker::ir::Addr> *)
                                       &p_12.
                                        super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                          this_local = (Interpreter *)(idx + 1);
                          p_1.
                          super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_ = 1;
                          std::vector<long,_std::allocator<long>_>::~vector
                                    ((vector<long,_std::allocator<long>_> *)&__range3);
                        }
                        else {
                          p_1.
                          super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_ = 0;
                        }
                        std::shared_ptr<mocker::ir::Call>::~shared_ptr
                                  ((shared_ptr<mocker::ir::Call> *)
                                   &args.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
                        if (p_1.
                            super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_ == 0) {
                          dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
                                    ((ir *)&phis.
                                            super__Vector_base<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (shared_ptr<mocker::ir::IRInst> *)&func);
                          bVar2 = std::__shared_ptr::operator_cast_to_bool
                                            ((__shared_ptr *)
                                             &phis.
                                              super__Vector_base<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          if (bVar2) {
                            std::
                            vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                            ::vector((vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                      *)&phi.
                                         super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
                            ar = (value_type *)idx;
                            do {
                              pFVar6 = std::
                                       reference_wrapper<const_mocker::ir::Interpreter::FuncModule>
                                       ::get((reference_wrapper<const_mocker::ir::Interpreter::FuncModule>
                                              *)inst.
                                                super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi);
                              pvVar7 = std::
                                       vector<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                                       ::at(&pFVar6->insts,(size_type)ar);
                              dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                                        ((ir *)local_340,pvVar7);
                              bVar2 = std::__shared_ptr::operator_cast_to_bool
                                                ((__shared_ptr *)local_340);
                              if (bVar2) {
                                std::
                                vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>
                                ::emplace_back<std::shared_ptr<mocker::ir::Phi>>
                                          ((vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>
                                            *)&phi.
                                               super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount,(shared_ptr<mocker::ir::Phi> *)local_340
                                          );
                                ar = (value_type *)((long)&(ar->curFunc)._M_data + 1);
                              }
                              else {
                                executePhis(this,(vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                                  *)&phi.
                                                  super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                this_local = (Interpreter *)ar;
                              }
                              p_1.
                              super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._5_3_ = 0;
                              p_1.
                              super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._4_1_ = !bVar2;
                              std::shared_ptr<mocker::ir::Phi>::~shared_ptr
                                        ((shared_ptr<mocker::ir::Phi> *)local_340);
                            } while (p_1.
                                     super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_ == 0);
                            std::
                            vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                            ::~vector((vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                       *)&phi.
                                          super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                          }
                          else {
                            p_1.
                            super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._4_4_ = 0;
                          }
                          std::shared_ptr<mocker::ir::Phi>::~shared_ptr
                                    ((shared_ptr<mocker::ir::Phi> *)
                                     &phis.
                                      super__Vector_base<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          if (p_1.
                              super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._4_4_ == 0) {
                            __assert_fail("false",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                                          ,0x25e,
                                          "std::size_t mocker::ir::Interpreter::executeInst(std::size_t)"
                                         );
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr((shared_ptr<mocker::ir::IRInst> *)&func);
  return (size_t)this_local;
}

Assistant:

std::size_t Interpreter::executeInst(std::size_t idx) {
  auto &ar = ars.top();
  auto inst = ar.curFunc.get().insts.at(idx);
#ifdef PRINT_LOG
  std::cerr << fmtInst(inst) << std::endl;
#endif
  auto &func = ar.curFunc;
  if (auto p = dyc<Assign>(inst)) {
    auto operand = readVal(p->getOperand());
    writeReg(p->getDest(), operand);
    return idx + 1;
  }
  if (auto p = dyc<ArithUnaryInst>(inst)) {
    auto operand = readVal(p->getOperand());
    writeReg(p->getDest(),
             p->getOp() == ArithUnaryInst::OpType::Neg ? -operand : ~operand);
    return idx + 1;
  }
  if (auto p = dyc<ArithBinaryInst>(inst)) {
    auto lhs = readVal(p->getLhs()), rhs = readVal(p->getRhs());
    switch (p->getOp()) {
    case ArithBinaryInst::BitOr:
      writeReg(p->getDest(), lhs | rhs);
      break;
    case ArithBinaryInst::BitAnd:
      writeReg(p->getDest(), lhs & rhs);
      break;
    case ArithBinaryInst::Xor:
      writeReg(p->getDest(), lhs ^ rhs);
      break;
    case ArithBinaryInst::Shl:
      writeReg(p->getDest(), lhs << rhs);
      break;
    case ArithBinaryInst::Shr:
      writeReg(p->getDest(), lhs >> rhs);
      break;
    case ArithBinaryInst::Add:
      writeReg(p->getDest(), lhs + rhs);
      break;
    case ArithBinaryInst::Sub:
      writeReg(p->getDest(), lhs - rhs);
      break;
    case ArithBinaryInst::Mul:
      writeReg(p->getDest(), lhs * rhs);
      break;
    case ArithBinaryInst::Div:
      writeReg(p->getDest(), lhs / rhs);
      break;
    case ArithBinaryInst::Mod:
      writeReg(p->getDest(), lhs % rhs);
      break;
    default:
      assert(false);
    }
    return idx + 1;
  }
  if (auto p = dyc<RelationInst>(inst)) {
    auto lhs = readVal(p->getLhs()), rhs = readVal(p->getRhs());
    std::int64_t res;
    switch (p->getOp()) {
    case RelationInst::Eq:
      res = lhs == rhs;
      break;
    case RelationInst::Ne:
      res = lhs != rhs;
      break;
    case RelationInst::Lt:
      res = lhs < rhs;
      break;
    case RelationInst::Gt:
      res = lhs > rhs;
      break;
    case RelationInst::Le:
      res = lhs <= rhs;
      break;
    case RelationInst::Ge:
      res = lhs >= rhs;
      break;
    default:
      assert(false);
    }
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Load>(inst)) {
    auto addr = reinterpret_cast<std::int64_t *>(readVal(p->getAddr()));
    auto val = *addr;
    writeReg(p->getDest(), val);
    return idx + 1;
  }
  if (auto p = dyc<Store>(inst)) {
    std::int64_t val = readVal(p->getVal());
    auto addr = reinterpret_cast<std::int64_t *>(readVal(p->getAddr()));
    *addr = val;
    printLog((std::int64_t)addr, val);
    return idx + 1;
  }
  if (auto p = dyc<Alloca>(inst)) {
    auto res = fastMalloc(8);
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Malloc>(inst)) {
    auto sz = (std::size_t)readVal(p->getSize());
    auto res = fastMalloc(sz);
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Branch>(inst)) {
    auto condition = readVal(p->getCondition());
    auto nxtLabel = condition ? p->getThen() : p->getElse();
    ar.lastBB = ar.curBB;
    ar.curBB = nxtLabel->getID();
    return func.get().label2idx.at(nxtLabel->getID());
  }
  if (auto p = dyc<Jump>(inst)) {
    ar.lastBB = ar.curBB;
    ar.curBB = p->getLabel()->getID();
    return func.get().label2idx.at(p->getLabel()->getID());
  }
  if (auto p = dyc<Ret>(inst)) {
    if (p->getVal())
      ars.top().retVal = readVal(p->getVal());
    return func.get().insts.size();
  }
  if (auto p = dyc<Call>(inst)) {
    std::vector<std::int64_t> args;
    for (auto &argReg : p->getArgs())
      args.emplace_back(readVal(argReg));
    auto val = executeFunc(p->getFuncName(), args);
    if (p->getDest())
      writeReg(p->getDest(), val);
    return idx + 1;
  }
  if (auto p = dyc<Phi>(inst)) {
    std::vector<std::shared_ptr<Phi>> phis;
    while (true) {
      auto phi = dyc<Phi>(ar.curFunc.get().insts.at(idx));
      if (!phi) {
        executePhis(phis);
        return idx;
      }
      phis.emplace_back(std::move(phi));
      ++idx;
    }
  }
  assert(false);
}